

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkPartitionNaive(Abc_Ntk_t *pNtk,int nPartSize)

{
  bool bVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  undefined8 *puVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar7 = pNtk->vCos->nSize;
  iVar2 = iVar7 / nPartSize;
  bVar1 = 0 < iVar7 % nPartSize;
  uVar8 = iVar2 + (uint)bVar1;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  uVar6 = 8;
  if (6 < (iVar2 + (uint)bVar1) - 1) {
    uVar6 = uVar8;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar6;
  if (uVar6 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)(int)uVar6 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if (0 < (int)uVar8) {
    uVar9 = 0;
    do {
      puVar5 = (undefined8 *)malloc(0x10);
      *puVar5 = 0;
      puVar5[1] = 0;
      ppvVar4[uVar9] = puVar5;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  pVVar3->nSize = uVar8;
  if (0 < pNtk->vCos->nSize) {
    iVar7 = 0;
    do {
      iVar2 = (int)((long)iVar7 / (long)nPartSize);
      if ((iVar2 < 0) || ((int)uVar8 <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Vec_IntPush((Vec_Int_t *)ppvVar4[(long)iVar7 / (long)nPartSize & 0xffffffff],iVar7);
      iVar7 = iVar7 + 1;
    } while (iVar7 < pNtk->vCos->nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Abc_NtkPartitionNaive( Abc_Ntk_t * pNtk, int nPartSize )
{
    Vec_Ptr_t * vParts;
    Abc_Obj_t * pObj;
    int nParts, i;
    nParts = (Abc_NtkCoNum(pNtk) / nPartSize) + ((Abc_NtkCoNum(pNtk) % nPartSize) > 0);
    vParts = (Vec_Ptr_t *)Vec_VecStart( nParts );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_IntPush( (Vec_Int_t *)Vec_PtrEntry(vParts, i / nPartSize), i );
    return vParts;
}